

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_vrplib_edge_weight_section(VrplibParser *p,Instance *instance)

{
  _Bool _Var1;
  int64_t iVar2;
  int32_t local_64;
  double local_50;
  double value;
  char *lexeme;
  int local_38;
  int32_t lexid;
  int32_t idx;
  int32_t j;
  int32_t i;
  _Bool needs_edge_section;
  int32_t n;
  _Bool result;
  Instance *instance_local;
  VrplibParser *p_local;
  
  needs_edge_section = true;
  i = instance->num_customers + 1;
  _n = instance;
  instance_local = (Instance *)p;
  j._3_1_ = parser_needs_edge_section(p);
  if ((bool)j._3_1_) {
    if (_n->edge_weight == (double *)0x0) {
      __assert_fail("instance->edge_weight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,0x261,"_Bool parse_vrplib_edge_weight_section(VrplibParser *, Instance *)");
    }
    for (idx = 0; lexid = idx, idx < i; idx = idx + 1) {
      while (lexid = lexid + 1, lexid < i) {
        iVar2 = sxpos(i,idx,lexid);
        local_38 = (int)iVar2;
        for (lexeme._4_4_ = 0; lexeme._4_4_ < 3; lexeme._4_4_ = lexeme._4_4_ + 1) {
          value = (double)get_token_lexeme((VrplibParser *)instance_local);
          if ((lexeme._4_4_ == 0) || (lexeme._4_4_ == 1)) {
            if (lexeme._4_4_ == 0) {
              local_64 = idx;
            }
            else {
              local_64 = lexid;
            }
            needs_edge_section =
                 parse_node_id((VrplibParser *)instance_local,(char *)value,local_64);
          }
          else {
            local_50 = 0.0;
            _Var1 = str_to_double((char *)value,&local_50);
            if (_Var1) {
              _n->edge_weight[local_38] = local_50;
            }
            else {
              parse_error((VrplibParser *)instance_local,"Expected valid double for reduced cost");
              needs_edge_section = false;
            }
          }
          if (value != 0.0) {
            free((void *)value);
          }
          if ((needs_edge_section & 1U) == 0) goto LAB_0010510e;
        }
        _Var1 = parser_match_newline((VrplibParser *)instance_local);
        if (!_Var1) {
          parse_error((VrplibParser *)instance_local,
                      "Expected newline after reduced cost for arc `(%d, %d)``",(ulong)(idx + 1),
                      (ulong)(lexid + 1));
          needs_edge_section = false;
          goto LAB_0010510e;
        }
      }
    }
LAB_0010510e:
    p_local._7_1_ = (_Bool)(needs_edge_section & 1);
  }
  else {
    parse_error((VrplibParser *)instance_local,
                "Found un-expected `EDGE_WEIGHT_SECTION`. EDGE_WEIGHT_TYPE should be set accordingly"
               );
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

static bool parse_vrplib_edge_weight_section(VrplibParser *p,
                                             Instance *instance) {
    bool result = true;
    int32_t n = instance->num_customers + 1;

    bool needs_edge_section = parser_needs_edge_section(p);
    if (!needs_edge_section) {
        parse_error(p, "Found un-expected `EDGE_WEIGHT_SECTION`. "
                       "EDGE_WEIGHT_TYPE should be set accordingly");
        return false;
    }

    assert(instance->edge_weight);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = i + 1; j < n; j++) {
            int32_t idx = sxpos(n, i, j);

            for (int32_t lexid = 0; lexid < 3; lexid++) {
                char *lexeme = get_token_lexeme(p);
                if (lexid == 0 || lexid == 1) {
                    result = parse_node_id(p, lexeme, lexid == 0 ? i : j);
                } else {
                    // Parse the reduced cost variable
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p,
                                    "Expected valid double for reduced cost");
                        result = false;
                    } else {
                        instance->edge_weight[idx] = value;
                    }
                }

                if (lexeme) {
                    free(lexeme);
                }

                if (!result) {
                    goto terminate;
                }
            }

            if (!parser_match_newline(p)) {
                parse_error(p,
                            "Expected newline after reduced cost for arc "
                            "`(%d, %d)``",
                            i + 1, j + 1);
                result = false;
                goto terminate;
            }
        }
    }

terminate:
    return result;
}